

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_exception.h
# Opt level: O0

void __thiscall rcdiscover::SocketException::~SocketException(SocketException *this)

{
  SocketException *in_RDI;
  
  ~SocketException(in_RDI);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

virtual ~SocketException() = default;